

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O0

void __thiscall UIDisplayer::drawGameplayScreen(UIDisplayer *this,World *world)

{
  PrimitiveDisplayer *pPVar1;
  int iVar2;
  Colour *pCVar3;
  Vec2d *this_00;
  Tetromino *pTVar4;
  TetrominoType *this_01;
  ostream *poVar5;
  undefined4 uVar6;
  Drawable *local_378;
  double local_340;
  double local_330;
  allocator local_309;
  string local_308;
  Vec2d local_2e4;
  allocator local_2d9;
  string local_2d8;
  Vec2d local_2b8;
  Vec2d local_2b0;
  Vec2d local_2a8;
  string local_2a0;
  Vec2d local_280;
  char local_275;
  int local_274;
  stringstream local_270 [8];
  stringstream ss;
  ostream local_260 [383];
  allocator local_e1;
  string local_e0;
  Vec2d local_c0;
  Vec2d local_b8;
  Vec2d local_b0;
  Vec2d *local_a8;
  Vec2d *newShapePos;
  allocator local_89;
  string local_88;
  Vec2d local_68;
  Vec2d local_60;
  Vec2d local_58;
  int local_50;
  int local_4c;
  int i_1;
  int i;
  Vec2d local_40;
  Colour *local_38;
  Colour *shapeLineColour;
  Colour *shapeColour;
  Colour *borderColour;
  World *pWStack_18;
  GLfloat blockSize;
  World *world_local;
  UIDisplayer *this_local;
  
  borderColour._4_4_ = 30.0;
  pWStack_18 = world;
  world_local = (World *)this;
  shapeColour = Palette::getColour(this->palette,8);
  shapeLineColour = Palette::getColour(this->palette,1);
  local_38 = Palette::getColour(this->palette,8);
  pPVar1 = this->primitiveDisplayer;
  Vec2d::Vec2d(&local_40,borderColour._4_4_,borderColour._4_4_);
  Vec2d::Vec2d((Vec2d *)&i_1,borderColour._4_4_ * 10.0,borderColour._4_4_ * 20.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_40,_i_1,shapeColour);
  glPushMatrix();
  glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3f000000);
  glTranslatef(0x3f800000,0x3f800000,0);
  for (local_4c = 1; local_4c < 10; local_4c = local_4c + 1) {
    glPushMatrix();
    glTranslatef(borderColour._4_4_,0);
    local_330 = 5.0;
    if (local_4c % 5 != 0) {
      local_330 = 0.5;
    }
    glLineWidth(CONCAT44((int)((ulong)local_330 >> 0x20),(float)local_330));
    glBegin(1);
    glVertex2f((float)local_4c * borderColour._4_4_,borderColour._4_4_);
    glVertex2f((float)local_4c * borderColour._4_4_,borderColour._4_4_ * 21.0);
    glEnd();
    glPopMatrix();
  }
  for (local_50 = 1; local_50 < 0x14; local_50 = local_50 + 1) {
    glPushMatrix();
    glTranslatef(0,borderColour._4_4_);
    uVar6 = 0x3fe00000;
    local_340 = 5.0;
    if (local_50 % 5 != 0) {
      local_340 = 0.5;
    }
    glLineWidth(CONCAT44((int)((ulong)local_340 >> 0x20),(float)local_340));
    glBegin(1);
    glVertex2f(borderColour._4_4_,CONCAT44(uVar6,(float)local_50 * borderColour._4_4_));
    glVertex2f(borderColour._4_4_ * 11.0,(float)local_50 * borderColour._4_4_);
    glEnd();
    glPopMatrix();
  }
  glPopMatrix();
  pPVar1 = this->primitiveDisplayer;
  Vec2d::Vec2d(&local_58,borderColour._4_4_ * 12.0,borderColour._4_4_);
  Vec2d::Vec2d(&local_60,borderColour._4_4_ * 9.0,borderColour._4_4_ * 4.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_58,local_60,shapeColour);
  Vec2d::Vec2d(&local_68,borderColour._4_4_ * 12.0 + 12.0,borderColour._4_4_ + 14.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"NEXT",&local_89);
  pCVar3 = Palette::getColour(this->palette,2);
  drawParagraphAtCoords(this,local_68,&local_88,4.0,pCVar3,false);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  glPushMatrix();
  this_00 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_00,0.0,20.0);
  local_a8 = this_00;
  glTranslatef(borderColour._4_4_ * 17.0,
               CONCAT44((int)((ulong)((double)borderColour._4_4_ * 4.5) >> 0x20),
                        (float)((double)borderColour._4_4_ * 4.5)),0);
  pPVar1 = this->primitiveDisplayer;
  pTVar4 = World::getNextTet(pWStack_18);
  local_378 = (Drawable *)0x0;
  if (pTVar4 != (Tetromino *)0x0) {
    local_378 = &pTVar4->super_Drawable;
  }
  pTVar4 = World::getNextTet(pWStack_18);
  this_01 = Tetromino::getType(pTVar4);
  iVar2 = TetrominoType::getDisplayRotation(this_01);
  PrimitiveDisplayer::drawableWithGLRotation(pPVar1,local_378,(float)iVar2,local_a8);
  if (local_a8 != (Vec2d *)0x0) {
    operator_delete(local_a8);
  }
  local_a8 = (Vec2d *)0x0;
  glPopMatrix();
  pPVar1 = this->primitiveDisplayer;
  Vec2d::Vec2d(&local_b0,borderColour._4_4_ * 12.0,borderColour._4_4_ * 6.0);
  Vec2d::Vec2d(&local_b8,borderColour._4_4_ * 9.0,borderColour._4_4_ * 4.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_b0,local_b8,shapeColour);
  Vec2d::Vec2d(&local_c0,borderColour._4_4_ * 12.0 + 12.0,borderColour._4_4_ * 6.0 + 14.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"SCORE",&local_e1);
  pCVar3 = Palette::getColour(this->palette,2);
  drawParagraphAtCoords(this,local_c0,&local_e0,4.0,pCVar3,false);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::stringstream::stringstream(local_270);
  local_274 = (int)std::setw(6);
  poVar5 = std::operator<<(local_260,(_Setw)local_274);
  local_275 = (char)std::setfill<char>('0');
  poVar5 = std::operator<<(poVar5,local_275);
  iVar2 = World::getScore(pWStack_18);
  std::ostream::operator<<(poVar5,iVar2);
  Vec2d::Vec2d(&local_280,borderColour._4_4_ * 12.0 + 12.0,borderColour._4_4_ * 7.0 + 26.0);
  std::__cxx11::stringstream::str();
  pCVar3 = Palette::getColour(this->palette,0);
  drawParagraphAtCoords(this,local_280,&local_2a0,7.0,pCVar3,true);
  std::__cxx11::string::~string((string *)&local_2a0);
  pPVar1 = this->primitiveDisplayer;
  Vec2d::Vec2d(&local_2a8,borderColour._4_4_ * 12.0,borderColour._4_4_ * 17.0);
  Vec2d::Vec2d(&local_2b0,borderColour._4_4_ * 9.0,borderColour._4_4_ * 4.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_2a8,local_2b0,shapeColour);
  Vec2d::Vec2d(&local_2b8,borderColour._4_4_ * 12.0 + 88.0,borderColour._4_4_ * 17.0 + 14.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"LANA",&local_2d9);
  pCVar3 = Palette::getColour(this->palette,2);
  drawParagraphAtCoords(this,local_2b8,&local_2d8,4.0,pCVar3,false);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  Vec2d::Vec2d(&local_2e4,borderColour._4_4_ * 12.0 + 12.0,borderColour._4_4_ * 18.0 + 26.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"TETRIS",&local_309);
  pCVar3 = Palette::getColour(this->palette,0);
  drawParagraphAtCoords(this,local_2e4,&local_308,7.0,pCVar3,true);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  shapeColour = (Colour *)0x0;
  shapeLineColour = (Colour *)0x0;
  local_38 = (Colour *)0x0;
  std::__cxx11::stringstream::~stringstream(local_270);
  return;
}

Assistant:

void UIDisplayer::drawGameplayScreen(World* world) {
    GLfloat blockSize = 30;

    Colour* borderColour = palette->getColour(Palette::WHITE);
    Colour* shapeColour = palette->getColour(Palette::ORANGE);
    Colour* shapeLineColour = palette->getColour(Palette::WHITE);
    
    // field
    primitiveDisplayer->drawRectangleOutline(Vec2d(blockSize, blockSize), Vec2d(10 * blockSize, 20 * blockSize), borderColour);
    
    //grid
    glPushMatrix();
        glColor4f(1.f, 1.f, 1.f, 0.5f);
        glTranslatef(1, 1, 0);
        for (int i = 1; i < 10; i++) {
            glPushMatrix();
                glTranslatef(blockSize, 0, 0);
                glLineWidth((i%5==0) ? 5 : 0.5);
                glBegin(GL_LINES);
                    glVertex2f(i*blockSize, blockSize);
                    glVertex2f(i*blockSize, 21 * blockSize);
                glEnd();
            glPopMatrix();
        }
        for (int i = 1; i < 20; i++) {
            glPushMatrix();
                glTranslatef(0, blockSize, 0);
                glLineWidth((i%5==0) ? 5 : 0.5);
                glBegin(GL_LINES);
                    glVertex2f(blockSize, i*blockSize);
                    glVertex2f(11*blockSize, i* blockSize);
                glEnd();
            glPopMatrix();
        }
    glPopMatrix();
    
    // next shape
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, blockSize + 14), "NEXT", 4, palette->getColour(Palette::PINK), false);
    
    glPushMatrix();
        Vec2d* newShapePos = new Vec2d(0, 20);
        glTranslatef(17 * blockSize, 4.5 * blockSize, 0.f);
        primitiveDisplayer->drawableWithGLRotation(world->getNextTet(), world->getNextTet()->getType()->getDisplayRotation(), newShapePos);
        delete newShapePos;
        newShapePos = nullptr;
    glPopMatrix();

    
    // score
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, 6 * blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 6 * blockSize + 14), "SCORE", 4, palette->getColour(Palette::PINK), false);
    
    stringstream ss;
    ss << setw(6) << setfill('0') << world->getScore();
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 7 * blockSize + 26), ss.str(), 7, palette->getColour(Palette::GREEN), true);
    
    // logo
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, 17 * blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 88, 17 * blockSize + 14), "LANA", 4, palette->getColour(Palette::PINK), false);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 18 * blockSize + 26), "TETRIS", 7, palette->getColour(Palette::GREEN), true);
    
    borderColour = nullptr;
    shapeColour = nullptr;
    shapeLineColour = nullptr;
}